

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FS.cpp
# Opt level: O0

ssize_t File::read(int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  istream *piVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278;
  undefined1 local_258 [8];
  string line;
  bool first;
  istream local_228 [8];
  ifstream in;
  string *contents_local;
  string *name_local;
  
  std::__cxx11::string::operator=((string *)__buf,"");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_228,pcVar3,_S_in);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    name_local._7_1_ = 0;
  }
  else {
    line.field_2._M_local_buf[0xb] = '\x01';
    std::__cxx11::string::string((string *)local_258);
    std::__cxx11::string::reserve((ulong)local_258);
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_228,(string *)local_258);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar2) break;
      if ((line.field_2._M_local_buf[0xb] & 1U) != 0) {
        removeBOM(&local_278,(string *)local_258);
        std::__cxx11::string::operator=((string *)local_258,(string *)&local_278);
        std::__cxx11::string::~string((string *)&local_278);
        line.field_2._M_local_buf[0xb] = '\0';
      }
      std::operator+(&local_298,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                     '\n');
      std::__cxx11::string::operator+=((string *)__buf,(string *)&local_298);
      std::__cxx11::string::~string((string *)&local_298);
    }
    std::ifstream::close();
    name_local._7_1_ = 1;
    std::__cxx11::string::~string((string *)local_258);
  }
  uVar5 = std::ifstream::~ifstream(local_228);
  return CONCAT71((int7)((ulong)uVar5 >> 8),name_local._7_1_);
}

Assistant:

bool File::read (const std::string& name, std::string& contents)
{
  contents = "";

  std::ifstream in (name.c_str ());
  if (in.good ())
  {
    bool first = true;
    std::string line;
    line.reserve (1024);
    while (getline (in, line))
    {
      // Detect forbidden BOM on first line.
      if (first)
      {
        line = File::removeBOM (line);
        first = false;
      }

      contents += line + '\n';
    }

    in.close ();
    return true;
  }

  return false;
}